

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::Own<capnp::PipelineHook>_>::truncate
          (ArrayBuilder<kj::Own<capnp::PipelineHook>_> *this,char *__file,__off_t __length)

{
  Own<capnp::PipelineHook> *pOVar1;
  PipelineHook *pPVar2;
  Own<capnp::PipelineHook> *pOVar3;
  Own<capnp::PipelineHook> *pOVar4;
  
  pOVar1 = this->ptr;
  pOVar4 = this->pos;
  while (pOVar3 = pOVar4, pOVar1 + (long)__file < pOVar3) {
    this->pos = pOVar3 + -1;
    pPVar2 = pOVar3[-1].ptr;
    pOVar4 = pOVar3 + -1;
    if (pPVar2 != (PipelineHook *)0x0) {
      pOVar3[-1].ptr = (PipelineHook *)0x0;
      (**(pOVar3[-1].disposer)->_vptr_Disposer)
                (pOVar3[-1].disposer,
                 pPVar2->_vptr_PipelineHook[-2] + (long)&pPVar2->_vptr_PipelineHook);
      pOVar4 = this->pos;
    }
  }
  return (int)pOVar3;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }